

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O0

stStateCore * __thiscall TripleBuffer<stStateCore>::get(TripleBuffer<stStateCore> *this)

{
  stStateCore *psVar1;
  long in_RDI;
  lock_guard<std::mutex> lock;
  stStateCore *in_stack_ffffffffffffffc8;
  stStateCore *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,
             (mutex_type *)in_stack_ffffffffffffffc8);
  if ((*(byte *)(in_RDI + 0x1d8) & 1) != 0) {
    stStateCore::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(undefined1 *)(in_RDI + 0x1d8) = 0;
  }
  psVar1 = (stStateCore *)(in_RDI + 0x3b8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19b3e1);
  return psVar1;
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }